

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall vkb::PhysicalDevice::is_extension_present(PhysicalDevice *this,char *ext)

{
  pointer pbVar1;
  int iVar2;
  long lVar3;
  pointer pbVar4;
  pointer pbVar5;
  
  pbVar5 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)pbVar5 >> 7;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      iVar2 = std::__cxx11::string::compare((char *)pbVar5);
      pbVar4 = pbVar5;
      if (iVar2 == 0) goto LAB_00121d25;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 1));
      pbVar4 = pbVar5 + 1;
      if (iVar2 == 0) goto LAB_00121d25;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 2));
      pbVar4 = pbVar5 + 2;
      if (iVar2 == 0) goto LAB_00121d25;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 3));
      pbVar4 = pbVar5 + 3;
      if (iVar2 == 0) goto LAB_00121d25;
      pbVar5 = pbVar5 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pbVar1 - (long)pbVar5 >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pbVar4 = pbVar1;
      if ((lVar3 != 3) ||
         (iVar2 = std::__cxx11::string::compare((char *)pbVar5), pbVar4 = pbVar5, iVar2 == 0))
      goto LAB_00121d25;
      pbVar5 = pbVar5 + 1;
    }
    iVar2 = std::__cxx11::string::compare((char *)pbVar5);
    pbVar4 = pbVar5;
    if (iVar2 == 0) goto LAB_00121d25;
    pbVar5 = pbVar5 + 1;
  }
  iVar2 = std::__cxx11::string::compare((char *)pbVar5);
  pbVar4 = pbVar1;
  if (iVar2 == 0) {
    pbVar4 = pbVar5;
  }
LAB_00121d25:
  return pbVar4 != (this->available_extensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool PhysicalDevice::is_extension_present(const char* ext) const {
    return std::find_if(std::begin(available_extensions), std::end(available_extensions), [ext](std::string const& ext_name) {
        return ext_name == ext;
    }) != std::end(available_extensions);
}